

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O3

lzma_match *
hc_find_func(uint32_t len_limit,uint32_t pos,uint8_t *cur,uint32_t cur_match,uint32_t depth,
            uint32_t *son,uint32_t cyclic_pos,uint32_t cyclic_size,lzma_match *matches,
            uint32_t len_best)

{
  ulong uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint8_t *puVar5;
  uint uVar6;
  ulong uVar7;
  
  son[cyclic_pos] = cur_match;
  uVar2 = pos - cur_match;
  if (cyclic_size <= uVar2 || depth == 0) {
    return matches;
  }
  do {
    puVar5 = cur + -(ulong)uVar2;
    uVar3 = 0;
    if (cyclic_pos < uVar2) {
      uVar3 = cyclic_size;
    }
    uVar3 = son[(cyclic_pos - uVar2) + uVar3];
    if ((puVar5[len_best] == cur[len_best]) && (*puVar5 == *cur)) {
      if (len_limit == 0) {
        __assert_fail("len <= limit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                      ,0x2e,
                      "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)"
                     );
      }
      if ((int)len_limit < 0) {
        __assert_fail("limit <= UINT32_MAX / 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                      ,0x2f,
                      "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)"
                     );
      }
      uVar6 = 1;
      if (1 < len_limit) {
        uVar4 = 1;
LAB_0075a093:
        uVar7 = *(long *)(puVar5 + uVar4) - *(long *)(cur + uVar4);
        if (uVar7 == 0) break;
        uVar1 = 0;
        if (uVar7 != 0) {
          for (; (uVar7 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
          }
        }
        uVar6 = ((uint)(uVar1 >> 3) & 0x1fffffff) + uVar4;
        if (len_limit <= uVar6) {
          uVar6 = len_limit;
        }
      }
LAB_0075a0c0:
      if (len_best < uVar6) {
        matches->len = uVar6;
        matches->dist = uVar2 - 1;
        matches = matches + 1;
        len_best = uVar6;
        if (uVar6 == len_limit) {
          return matches;
        }
      }
    }
    depth = depth - 1;
    if (depth == 0) {
      return matches;
    }
    uVar2 = pos - uVar3;
    if (cyclic_size <= uVar2) {
      return matches;
    }
  } while( true );
  uVar4 = uVar4 + 8;
  uVar6 = len_limit;
  if (len_limit <= uVar4) goto LAB_0075a0c0;
  goto LAB_0075a093;
}

Assistant:

static lzma_match *
hc_find_func(
		const uint32_t len_limit,
		const uint32_t pos,
		const uint8_t *const cur,
		uint32_t cur_match,
		uint32_t depth,
		uint32_t *const son,
		const uint32_t cyclic_pos,
		const uint32_t cyclic_size,
		lzma_match *matches,
		uint32_t len_best)
{
	son[cyclic_pos] = cur_match;

	while (true) {
		const uint32_t delta = pos - cur_match;
		if (depth-- == 0 || delta >= cyclic_size)
			return matches;

		const uint8_t *const pb = cur - delta;
		cur_match = son[cyclic_pos - delta
				+ (delta > cyclic_pos ? cyclic_size : 0)];

		if (pb[len_best] == cur[len_best] && pb[0] == cur[0]) {
			uint32_t len = lzma_memcmplen(pb, cur, 1, len_limit);

			if (len_best < len) {
				len_best = len;
				matches->len = len;
				matches->dist = delta - 1;
				++matches;

				if (len == len_limit)
					return matches;
			}
		}
	}
}